

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::property::write_dts(property *this,FILE *file,int indent)

{
  value_type *__x;
  value_type *pvVar1;
  pointer ppVar2;
  bool bVar3;
  pointer ppVar4;
  int iVar5;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *pvVar6;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> v;
  
  pvVar6 = &v;
  iVar5 = 0;
  if (0 < indent) {
    iVar5 = indent;
  }
  while (iVar5 != 0) {
    putc(9,(FILE *)file);
    iVar5 = iVar5 + -1;
  }
  v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&v.
                 super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)v.
                        super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  bVar3 = std::operator!=(&this->key,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
  std::__cxx11::string::~string((string *)&v);
  if (bVar3) {
    fputs((this->key)._M_dataplus._M_p,(FILE *)file);
  }
  __x = (this->values).
        super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->values).
           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((ulong)(((long)pvVar1 - (long)__x) / 0x60) < 2) {
      pvVar6 = &this->values;
    }
    else {
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&v,__x);
      ppVar4 = (this->values).
               super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->values).
               super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while (ppVar4 = ppVar4 + 1, ppVar4 != ppVar2) {
        bVar3 = property_value::try_to_merge
                          (v.
                           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,ppVar4);
        if (!bVar3) {
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back(&v,ppVar4);
        }
      }
    }
    fputs(" = ",(FILE *)file);
    ppVar4 = (pvVar6->
             super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (pvVar6->
             super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while (ppVar4 != ppVar2) {
      property_value::write_dts(ppVar4,file);
      ppVar4 = ppVar4 + 1;
      if (ppVar4 != ppVar2) {
        putc(0x2c,(FILE *)file);
        putc(0x20,(FILE *)file);
      }
    }
    std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::~vector(&v);
  }
  fputs(";\n",(FILE *)file);
  return;
}

Assistant:

void
property::write_dts(FILE *file, int indent)
{
	for (int i=0 ; i<indent ; i++)
	{
		putc('\t', file);
	}
#ifdef PRINT_LABELS
	for (auto &l : labels)
	{
		fputs(l.c_str(), file);
		fputs(": ", file);
	}
#endif
	if (key != string())
	{
		fputs(key.c_str(), file);
	}
	if (!values.empty())
	{
		std::vector<property_value> *vals = &values;
		std::vector<property_value> v;
		// If we've got multiple values then try to merge them all together.
		if (values.size() > 1)
		{
			vals = &v;
			v.push_back(values.front());
			for (auto i=(++begin()), e=end() ; i!=e ; ++i)
			{
				if (!v.back().try_to_merge(*i))
				{
					v.push_back(*i);
				}
			}
		}
		fputs(" = ", file);
		for (auto i=vals->begin(), e=vals->end() ; i!=e ; ++i)
		{
			i->write_dts(file);
			if (i+1 != e)
			{
				putc(',', file);
				putc(' ', file);
			}
		}
	}
	fputs(";\n", file);
}